

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::RestoreFindDefinitions(cmFindPackageCommand *this)

{
  cmMakefile *this_00;
  _Base_ptr p_Var1;
  string_view value;
  
  for (p_Var1 = (this->OriginalDefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->OriginalDefs)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = (this->super_cmFindCommon).Makefile;
    if ((char)p_Var1[2]._M_color == _S_black) {
      value._M_str = (char *)p_Var1[2]._M_parent;
      value._M_len = (size_t)p_Var1[2]._M_left;
      cmMakefile::AddDefinition(this_00,(string *)(p_Var1 + 1),value);
    }
    else {
      cmMakefile::RemoveDefinition(this_00,(string *)(p_Var1 + 1));
    }
  }
  return;
}

Assistant:

void cmFindPackageCommand::RestoreFindDefinitions()
{
  for (auto const& i : this->OriginalDefs) {
    OriginalDef const& od = i.second;
    if (od.exists) {
      this->Makefile->AddDefinition(i.first, od.value);
    } else {
      this->Makefile->RemoveDefinition(i.first);
    }
  }
}